

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall
MipsParser::parseRspOffsetElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Token *pTVar3;
  Identifier local_68;
  string local_48;
  long local_28;
  
  dest->type = RspOffsetElement;
  pTVar3 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar3->type == LBrack) {
    Tokenizer::eatTokens
              ((parser->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer,1);
    pTVar3 = Tokenizer::nextToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    if (pTVar3->type == Integer) {
      if (*(__index_type *)
           ((long)&(pTVar3->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) != '\x01') {
LAB_00167159:
        __assert_fail("std::holds_alternative<int64_t>(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                      ,0x59,"int64_t Token::intValue() const");
      }
      local_28 = *(long *)&(pTVar3->value).
                           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           ._M_u;
      if (local_28 < 0x10) {
        tinyformat::format<long>(&local_48,"%d",&local_28);
        Identifier::Identifier(&local_68,&local_48);
        std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._name._M_dataplus._M_p != &local_68._name.field_2) {
          operator_delete(local_68._name._M_dataplus._M_p,
                          local_68._name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (*(__index_type *)
             ((long)&(pTVar3->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
             + 0x20) == '\x01') {
          dest->num = *(int *)&(pTVar3->value).
                               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               .
                               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                               ._M_u;
          pTVar3 = Tokenizer::nextToken
                             ((parser->entries).
                              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
          return pTVar3->type == RBrack;
        }
        goto LAB_00167159;
      }
    }
    bVar2 = false;
  }
  else {
    dest->num = 0;
    paVar1 = &local_68._name.field_2;
    local_68._name.field_2._M_allocated_capacity = 0;
    local_68._name.field_2._8_8_ = 0;
    local_68._name._M_string_length = 0;
    local_68._name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._name._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._name._M_dataplus._M_p,
                      local_68._name.field_2._M_allocated_capacity + 1);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool MipsParser::parseRspOffsetElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspOffsetElement;

	if (parser.peekToken().type == TokenType::LBrack)
	{
		parser.eatToken();

		const Token &token = parser.nextToken();

		if (token.type != TokenType::Integer || token.intValue() >= 16)
			return false;

		dest.name = Identifier(tfm::format("%d", token.intValue()));
		dest.num = (int)token.intValue();

		return parser.nextToken().type == TokenType::RBrack;
	}

	dest.num = 0;
	dest.name = Identifier();

	return true;
}